

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTcSymObjBase::fold_constant(CTcSymObjBase *this)

{
  _func_int **pp_Var1;
  CTcPrsNode *pCVar2;
  size_t in_RSI;
  
  if (this->metaclass_ != TC_META_TADSOBJ) {
    return (CTcPrsNode *)0x0;
  }
  pp_Var1 = (_func_int **)this->obj_id_;
  pCVar2 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,in_RSI);
  *(undefined4 *)&pCVar2[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 7;
  pCVar2[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  *(undefined4 *)&pCVar2[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 0;
  *(undefined1 *)&pCVar2[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 0;
  (pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_003505b8;
  return pCVar2;
}

Assistant:

CTcPrsNode *CTcSymObjBase::fold_constant()
{
    /* if it's not a TadsObject symbol, we can't fold it into a constant */
    if (get_metaclass() != TC_META_TADSOBJ)
        return 0;

    /* set up the object constant */
    CTcConstVal cval;
    cval.set_obj(get_obj_id(), get_metaclass());

    /* return a constant node */
    return new CTPNConst(&cval);
}